

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::BlockDisconnected
          (PeerManagerImpl *this,shared_ptr<const_CBlock> *block,CBlockIndex *pindex)

{
  CRollingBloomFilter *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock41;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->m_tx_download_mutex).super_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  this_00 = RecentConfirmedTransactionsFilter(this);
  CRollingBloomFilter::reset(this_00);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockDisconnected(const std::shared_ptr<const CBlock> &block, const CBlockIndex* pindex)
{
    // To avoid relay problems with transactions that were previously
    // confirmed, clear our filter of recently confirmed transactions whenever
    // there's a reorg.
    // This means that in a 1-block reorg (where 1 block is disconnected and
    // then another block reconnected), our filter will drop to having only one
    // block's worth of transactions in it, but that should be fine, since
    // presumably the most common case of relaying a confirmed transaction
    // should be just after a new block containing it is found.
    LOCK(m_tx_download_mutex);
    RecentConfirmedTransactionsFilter().reset();
}